

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompRelativeLocationPath(xmlXPathParserContextPtr ctxt)

{
  bool bVar1;
  xmlXPathParserContextPtr ctxt_local;
  
  while( true ) {
    bVar1 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
      bVar1 = *ctxt->cur == '\r';
    }
    if (!bVar1) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if ((*ctxt->cur == '/') && (ctxt->cur[1] == '/')) {
    ctxt->cur = ctxt->cur + 2;
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
  }
  else if (*ctxt->cur == '/') {
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
  }
  xmlXPathCompStep(ctxt);
  if (ctxt->error == 0) {
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    while (*ctxt->cur == '/') {
      if ((*ctxt->cur == '/') && (ctxt->cur[1] == '/')) {
        ctxt->cur = ctxt->cur + 2;
        while( true ) {
          bVar1 = true;
          if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
            bVar1 = *ctxt->cur == '\r';
          }
          if (!bVar1) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0)
        ;
        xmlXPathCompStep(ctxt);
      }
      else if (*ctxt->cur == '/') {
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        while( true ) {
          bVar1 = true;
          if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
            bVar1 = *ctxt->cur == '\r';
          }
          if (!bVar1) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        xmlXPathCompStep(ctxt);
      }
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompRelativeLocationPath
(xmlXPathParserContextPtr ctxt) {
    SKIP_BLANKS;
    if ((CUR == '/') && (NXT(1) == '/')) {
	SKIP(2);
	SKIP_BLANKS;
	PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		         NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);
    } else if (CUR == '/') {
	    NEXT;
	SKIP_BLANKS;
    }
    xmlXPathCompStep(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while (CUR == '/') {
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;
	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
			     NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);
	    xmlXPathCompStep(ctxt);
	} else if (CUR == '/') {
	    NEXT;
	    SKIP_BLANKS;
	    xmlXPathCompStep(ctxt);
	}
	SKIP_BLANKS;
    }
}